

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O1

TextureCube * __thiscall deqp::gls::RandomShaderCase::getTexCube(RandomShaderCase *this)

{
  GLenum err;
  TextureCube *this_00;
  long lVar1;
  Vec4 (*minVal) [2];
  int face;
  long lVar2;
  
  if (this->m_texCube == (TextureCube *)0x0) {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,0x1908,0x1401,0x10);
    this->m_texCube = this_00;
    if (getTexCube()::gradients == '\0') {
      getTexCube();
    }
    lVar1 = 0xb0;
    minVal = getTexCube::gradients;
    lVar2 = 0;
    do {
      tcu::TextureCube::allocLevel(&this->m_texCube->m_refTexture,(CubeFace)lVar2,0);
      tcu::fillWithComponentGradients
                (*(PixelBufferAccess **)
                  ((long)(this->m_texCube->m_refTexture).m_data + lVar1 + -0x20),*minVal,
                 (Vec4 *)((long)minVal + 0x10));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
      minVal = (Vec4 (*) [2])((long)minVal + 0x20);
    } while (lVar2 != 6);
    glu::TextureCube::upload(this->m_texCube);
    glwBindTexture(0x8513,this->m_texCube->m_glTexture);
    glwTexParameteri(0x8513,0x2802,0x812f);
    glwTexParameteri(0x8513,0x2803,0x812f);
    glwTexParameteri(0x8513,0x2801,0x2601);
    glwTexParameteri(0x8513,0x2800,0x2601);
    err = glwGetError();
    glu::checkError(err,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x15d);
  }
  return this->m_texCube;
}

Assistant:

const glu::TextureCube* RandomShaderCase::getTexCube (void)
{
	if (!m_texCube)
	{
		m_texCube = new glu::TextureCube(m_renderCtx, TEXTURE_CUBE_FORMAT, TEXTURE_CUBE_DATA_TYPE, TEXTURE_CUBE_SIZE);

		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};

		// Fill level 0.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_texCube->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
			tcu::fillWithComponentGradients(m_texCube->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gradients[face][0], gradients[face][1]);
		}

		m_texCube->upload();

		// Setup parameters.
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_texCube->getGLTexture());
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		TEXTURE_WRAP_S);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		TEXTURE_WRAP_T);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	TEXTURE_MIN_FILTER);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	TEXTURE_MAG_FILTER);

		GLU_CHECK();
	}

	return m_texCube;
}